

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_ElementsSignTransactionTest_Test::TestBody
          (cfdcapi_transaction_ElementsSignTransactionTest_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *in_R9;
  long *expected_predicate_value;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  int tmp_ret;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  char *tapscript_err_msg;
  char *err_msg;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  char *tx_hex;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  uint32_t code_separator_pos;
  AssertionResult gtest_ar_5;
  bool has_tapscript;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  char *tmp_sig;
  char *sig;
  char *sighash;
  void *create_handle;
  ScopedTrace gtest_trace_1510;
  size_t idx;
  size_t list_size;
  CfdSignTransactionTestData exp_datas [4];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  undefined1 in_stack_00000d7f;
  char *in_stack_00000d80;
  int64_t in_stack_00000d88;
  uint32_t in_stack_00000d94;
  char *in_stack_00000d98;
  void *in_stack_00000da0;
  void *in_stack_00000da8;
  char *in_stack_00000dc0;
  char *in_stack_00000dc8;
  char *in_stack_00000dd0;
  char *in_stack_00000dd8;
  bool *******in_stack_fffffffffffff668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff670;
  undefined4 uVar7;
  int *piVar6;
  undefined4 uVar8;
  CfdErrorCode *in_stack_fffffffffffff678;
  char *in_stack_fffffffffffff680;
  undefined4 uVar9;
  void **in_stack_fffffffffffff688;
  undefined7 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6af;
  undefined4 in_stack_fffffffffffff6b8;
  int in_stack_fffffffffffff6bc;
  char *in_stack_fffffffffffff6c0;
  undefined7 in_stack_fffffffffffff6c8;
  undefined1 in_stack_fffffffffffff6cf;
  ScopedTrace *in_stack_fffffffffffff6d0;
  char **in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff708;
  uint32_t in_stack_fffffffffffff70c;
  bool *******local_840;
  undefined4 in_stack_fffffffffffff7f0;
  uint32_t in_stack_fffffffffffff7f4;
  char *in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff800;
  char *in_stack_fffffffffffff808;
  AssertHelper local_790;
  Message local_788;
  undefined4 local_77c;
  AssertionResult local_778;
  AssertHelper local_768;
  Message local_760;
  undefined4 local_754;
  AssertionResult local_750;
  int local_73c;
  AssertHelper local_738;
  Message local_730;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  int in_stack_fffffffffffff8e0;
  uint32_t in_stack_fffffffffffff8e4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff8e8;
  AssertHelper in_stack_fffffffffffff8f0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff8f8;
  AssertionResult local_700;
  char *local_6f0;
  char *local_6e8;
  AssertHelper local_6e0;
  Message local_6d8;
  AssertionResult local_6d0;
  AssertHelper local_6c0;
  Message local_6b8;
  undefined4 local_6ac;
  undefined1 in_stack_fffffffffffff95b;
  int in_stack_fffffffffffff95c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff960;
  char *in_stack_fffffffffffff968;
  AssertHelper in_stack_fffffffffffff970;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff978;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff990;
  AssertHelper local_668;
  Message local_660;
  undefined4 local_654;
  AssertionResult local_650;
  AssertHelper local_640;
  Message local_638;
  undefined4 local_62c;
  AssertionResult local_628;
  AssertHelper in_stack_fffffffffffff9e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  char *in_stack_fffffffffffffa00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa08;
  AssertHelper local_5f0;
  Message local_5e8;
  undefined4 local_5dc;
  AssertionResult local_5d8;
  AssertHelper local_5c8;
  Message local_5c0;
  undefined4 local_5b4;
  AssertionResult local_5b0;
  AssertHelper local_5a0;
  Message local_598;
  undefined4 local_58c;
  AssertionResult local_588;
  AssertHelper local_578;
  Message local_570;
  undefined4 local_564;
  undefined1 in_stack_fffffffffffffaa2;
  undefined1 in_stack_fffffffffffffaa3;
  int in_stack_fffffffffffffaa4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  uint32_t in_stack_fffffffffffffab4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  uint32_t in_stack_fffffffffffffac4;
  char *in_stack_fffffffffffffac8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffad0;
  AssertHelper in_stack_fffffffffffffad8;
  Message local_520;
  undefined4 local_514;
  char *in_stack_fffffffffffffaf0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffaf8;
  AssertHelper in_stack_fffffffffffffb00;
  uint32_t in_stack_fffffffffffffb0c;
  uint32_t in_stack_fffffffffffffb10;
  int in_stack_fffffffffffffb14;
  void *in_stack_fffffffffffffb18;
  AssertHelper local_4d8;
  Message local_4d0;
  undefined4 local_4c4;
  AssertionResult local_4c0;
  undefined4 local_4ac;
  AssertHelper local_4a8;
  Message local_4a0;
  undefined4 local_494;
  undefined1 in_stack_fffffffffffffb75;
  undefined1 in_stack_fffffffffffffb76;
  undefined1 in_stack_fffffffffffffb77;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb80;
  uint in_stack_fffffffffffffb84;
  AssertHelper in_stack_fffffffffffffb88;
  undefined6 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb96;
  undefined1 in_stack_fffffffffffffb97;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 uVar10;
  int in_stack_fffffffffffffba0;
  uint32_t in_stack_fffffffffffffba4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffba8;
  AssertHelper in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbd0;
  AssertHelper local_428;
  int in_stack_fffffffffffffbe0;
  AssertionResult local_410;
  string local_400;
  AssertHelper local_3e0;
  Message local_3d8;
  undefined1 local_3c9;
  AssertionResult local_3c8;
  AssertHelper local_3b8;
  Message local_3b0;
  undefined4 local_3a4;
  AssertionResult local_3a0;
  long local_390;
  bool *******local_388;
  long local_380;
  long local_378;
  string local_370 [32];
  string local_350 [39];
  ScopedTrace local_329;
  ulong local_328;
  ulong local_320;
  undefined1 local_318 [24];
  long alStack_300 [10];
  long alStack_2b0 [3];
  byte abStack_298 [16];
  byte abStack_288 [360];
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  string local_b0;
  AssertHelper local_90;
  Message local_88;
  undefined1 local_79;
  AssertionResult local_78;
  AssertHelper local_68;
  Message local_60 [3];
  undefined4 local_44;
  AssertionResult local_40;
  uint32_t local_2c;
  long local_28;
  
  local_28 = 0;
  local_2c = CfdCreateHandle(in_stack_fffffffffffff688);
  local_44 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,in_stack_fffffffffffff678,
             (int *)in_stack_fffffffffffff670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  local_840 = in_stack_fffffffffffff668;
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d2c8f);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x582,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message((Message *)0x3d2cf2);
    local_840 = in_stack_fffffffffffff668;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d2d47);
  local_79 = local_28 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff670,(bool *)local_840,(type *)0x3d2d7b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&local_78,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x583,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message((Message *)0x3d2e77);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d2ef2);
  memcpy(local_318,&DAT_009f5d50,0x260);
  local_320 = 4;
  for (local_328 = 0; local_328 < local_320; local_328 = local_328 + 1) {
    std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
    std::operator+((char *)in_stack_fffffffffffff678,in_stack_fffffffffffff670);
    testing::ScopedTrace::ScopedTrace
              (in_stack_fffffffffffff6d0,
               (char *)CONCAT17(in_stack_fffffffffffff6cf,in_stack_fffffffffffff6c8),
               (int)((ulong)in_stack_fffffffffffff6c0 >> 0x20),
               (string *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string(local_370);
    local_378 = 0;
    local_380 = 0;
    local_388 = (bool *******)0x0;
    local_390 = 0;
    expected_predicate_value = &local_378;
    local_2c = CfdInitializeTransaction
                         (in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,
                          in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
                          (char *)in_stack_fffffffffffffb00.data_,
                          (void **)in_stack_fffffffffffffaf8.ptr_);
    local_3a4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,in_stack_fffffffffffff678
               ,(int *)in_stack_fffffffffffff670);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a0);
    if (!bVar1) {
      testing::Message::Message(&local_3b0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d3139);
      testing::internal::AssertHelper::AssertHelper
                (&local_3b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x5ed,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
      testing::internal::AssertHelper::~AssertHelper(&local_3b8);
      testing::Message::~Message((Message *)0x3d319c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d31f1);
    local_3c9 = local_378 != 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff670,(bool *)local_840,(type *)0x3d321d);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c8);
    if (!bVar1) {
      testing::Message::Message(&local_3d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_400,(internal *)&local_3c8,(AssertionResult *)"(NULL == create_handle)",
                 "true","false",(char *)expected_predicate_value);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x5ee,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper(&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      testing::Message::~Message((Message *)0x3d331b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d3396);
    if (local_2c == 0) {
      local_840 = (bool *******)alStack_300[local_328 * 0x13];
      in_stack_fffffffffffff678 = *(CfdErrorCode **)(abStack_288 + local_328 * 0x98 + -0x10);
      in_stack_fffffffffffff688 =
           (void **)CONCAT44((int)((ulong)in_stack_fffffffffffff688 >> 0x20),1);
      in_stack_fffffffffffff680 = (char *)0x0;
      in_stack_fffffffffffff670 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_2c = CfdSetTransactionUtxoData
                           (in_stack_00000da8,in_stack_00000da0,in_stack_00000d98,in_stack_00000d94,
                            in_stack_00000d88,in_stack_00000d80,in_stack_00000dc0,in_stack_00000dc8,
                            in_stack_00000dd0,in_stack_00000dd8,(bool)in_stack_00000d7f);
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                 in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_410);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffbe0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d34d6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_428,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x5f4,pcVar4);
        testing::internal::AssertHelper::operator=(&local_428,(Message *)&stack0xfffffffffffffbe0);
        testing::internal::AssertHelper::~AssertHelper(&local_428);
        testing::Message::~Message((Message *)0x3d3539);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d3591);
      local_2c = CfdAddTransactionOutput
                           (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                            in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                            in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                 in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffbc8);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffbb8);
        in_stack_fffffffffffff808 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3d3690);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffbb0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x5f9,in_stack_fffffffffffff808);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffbb0,(Message *)&stack0xfffffffffffffbb8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbb0);
        testing::Message::~Message((Message *)0x3d36f3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d374b);
      uVar2 = CfdAddTransactionOutput
                        (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                         in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      uVar10 = 0;
      local_2c = uVar2;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                 in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffba0);
      in_stack_fffffffffffff800 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff800);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffb90);
        in_stack_fffffffffffff7f8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3d3850);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffb88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x5fe,in_stack_fffffffffffff7f8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffb88,(Message *)&stack0xfffffffffffffb90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb88);
        testing::Message::~Message((Message *)0x3d38b3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d3908);
      in_stack_fffffffffffffb84 = in_stack_fffffffffffffb84 & 0xffffff;
      if (local_2c == 0) {
        if ((abStack_288[local_328 * 0x98] & 1) == 0) {
          local_4ac = 0xffffffff;
          if (alStack_300[local_328 * 0x13 + 3] == 0) {
            local_840 = (bool *******)alStack_2b0[local_328 * 0x13 + -2];
          }
          else {
            local_840 = (bool *******)0x0;
          }
          in_stack_fffffffffffff670 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               alStack_300[local_328 * 0x13 + 3];
          in_stack_fffffffffffff678 = (CfdErrorCode *)alStack_300[local_328 * 0x13 + 5];
          in_stack_fffffffffffff688 = (void **)alStack_2b0[local_328 * 0x13 + -4];
          in_stack_fffffffffffff680 =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffff680 >> 0x20),0xffffffff);
          local_2c = CfdCreateSighashByHandle
                               (exp_datas[3].redeem_script,exp_datas[3].utxo_commitment,
                                (char *)exp_datas[3].utxo_amount,exp_datas[3].descriptor._4_4_,
                                (int)exp_datas[3].descriptor,(bool)exp_datas[3]._23_1_,
                                exp_datas[3].annex,exp_datas[3].aux_rand,exp_datas[3].pubkey,
                                (uint32_t)exp_datas[3].privkey,(char *)exp_datas[3]._104_8_,
                                (char **)exp_datas[3].txout_address);
          local_4c4 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                     in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
          if (!bVar1) {
            testing::Message::Message(&local_4d0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d3d4a);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4d8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x612,pcVar4);
            testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
            testing::internal::AssertHelper::~AssertHelper(&local_4d8);
            testing::Message::~Message((Message *)0x3d3dad);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d3e02);
          if (local_2c == 0) {
            sVar5 = strlen((char *)alStack_2b0[local_328 * 0x13 + -2]);
            if (sVar5 == 0x40) {
              local_2c = CfdSignSchnorr(in_stack_fffffffffffffa08.ptr_,in_stack_fffffffffffffa00,
                                        (char *)CONCAT44(in_stack_fffffffffffff9fc,
                                                         in_stack_fffffffffffff9f8),
                                        (char *)in_stack_fffffffffffff9f0.ptr_,
                                        (char **)in_stack_fffffffffffff9e8.data_);
              in_stack_fffffffffffffb14 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                         in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffb18);
              if (!bVar1) {
                testing::Message::Message((Message *)&stack0xfffffffffffffb08);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d3f35);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffb00,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x619,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffffb00,
                           (Message *)&stack0xfffffffffffffb08);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffb00);
                testing::Message::~Message((Message *)0x3d3f98);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d3ff0);
              local_2c = CfdAddSighashTypeInSchnorrSignature
                                   (in_stack_fffffffffffff808,
                                    (char *)CONCAT44(uVar2,in_stack_fffffffffffff800),
                                    (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
                                    SUB81((ulong)in_stack_fffffffffffff7f8 >> 0x18,0),
                                    (char **)CONCAT44(in_stack_fffffffffffff7f4,
                                                      in_stack_fffffffffffff7f0));
              local_514 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                         in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
              uVar7 = (undefined4)((ulong)in_stack_fffffffffffff670 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffaf0);
              if (!bVar1) {
                testing::Message::Message(&local_520);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d40e3);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffad8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x61c,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffffad8,&local_520);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffad8);
                testing::Message::~Message((Message *)0x3d4146);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d419e);
              if (alStack_300[local_328 * 0x13 + 3] == 0) {
                in_stack_fffffffffffff670 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     alStack_2b0[local_328 * 0x13 + -4];
                local_840 = (bool *******)0x0;
                local_2c = CfdAddTaprootSignByHandle
                                     (in_stack_fffffffffffffad8.data_,in_stack_fffffffffffffad0.ptr_
                                      ,in_stack_fffffffffffffac8,in_stack_fffffffffffffac4,
                                      (char *)in_stack_fffffffffffffab8.ptr_,
                                      (char *)CONCAT44(in_stack_fffffffffffffab4,
                                                       in_stack_fffffffffffffab0),
                                      in_stack_fffffffffffffaf0,
                                      (char *)in_stack_fffffffffffffaf8.ptr_);
                local_58c = 0;
                testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                          ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                           in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_588);
                if (!bVar1) {
                  testing::Message::Message(&local_598);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d4690);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_5a0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x62f,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
                  testing::internal::AssertHelper::~AssertHelper(&local_5a0);
                  testing::Message::~Message((Message *)0x3d46f3);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d4748);
              }
              else {
                in_stack_fffffffffffffb84 = CONCAT13(1,(int3)in_stack_fffffffffffffb84);
                piVar6 = (int *)CONCAT44(uVar7,(int)alStack_2b0[local_328 * 0x13]);
                in_stack_fffffffffffff680 =
                     (char *)CONCAT44((int)((ulong)in_stack_fffffffffffff680 >> 0x20),1);
                in_stack_fffffffffffff678 =
                     (CfdErrorCode *)((ulong)in_stack_fffffffffffff678 & 0xffffffff00000000);
                local_2c = CfdAddTxSignByHandle
                                     ((void *)CONCAT44(uVar10,in_stack_fffffffffffffb98),
                                      (void *)CONCAT17(in_stack_fffffffffffffb97,
                                                       CONCAT16(in_stack_fffffffffffffb96,
                                                                in_stack_fffffffffffffb90)),
                                      (char *)in_stack_fffffffffffffb88.data_,
                                      in_stack_fffffffffffffb84,in_stack_fffffffffffffb80,
                                      (char *)in_stack_fffffffffffffb78.ptr_,
                                      (bool)in_stack_fffffffffffffb77,in_stack_fffffffffffffbb8,
                                      (bool)in_stack_fffffffffffffb76,
                                      (bool)in_stack_fffffffffffffb75);
                in_stack_fffffffffffffac4 = 0;
                testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                          ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                           in_stack_fffffffffffff678,piVar6);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)&stack0xfffffffffffffac8);
                if (!bVar1) {
                  testing::Message::Message((Message *)&stack0xfffffffffffffab8);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d42ec);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffffab0,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x624,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&stack0xfffffffffffffab0,
                             (Message *)&stack0xfffffffffffffab8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffffab0);
                  testing::Message::~Message((Message *)0x3d434f);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d43a7);
                local_840 = (bool *******)alStack_300[local_328 * 0x13 + 4];
                in_stack_fffffffffffff670 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     alStack_2b0[local_328 * 0x13 + -4];
                local_2c = CfdAddTaprootSignByHandle
                                     (in_stack_fffffffffffffad8.data_,in_stack_fffffffffffffad0.ptr_
                                      ,in_stack_fffffffffffffac8,in_stack_fffffffffffffac4,
                                      (char *)in_stack_fffffffffffffab8.ptr_,
                                      (char *)CONCAT44(in_stack_fffffffffffffab4,
                                                       in_stack_fffffffffffffab0),
                                      in_stack_fffffffffffffaf0,
                                      (char *)in_stack_fffffffffffffaf8.ptr_);
                local_564 = 0;
                testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                          ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                           in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)&stack0xfffffffffffffaa0);
                if (!bVar1) {
                  testing::Message::Message(&local_570);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d44bf);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_578,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x62a,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_578,&local_570);
                  testing::internal::AssertHelper::~AssertHelper(&local_578);
                  testing::Message::~Message((Message *)0x3d4522);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d4577);
              }
            }
            else if (alStack_300[local_328 * 0x13 + 3] == 0) {
              local_840 = (bool *******)&local_388;
              local_2c = CfdCalculateEcSignature
                                   (in_stack_fffffffffffff978.ptr_,
                                    (char *)in_stack_fffffffffffff970.data_,
                                    in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960.ptr_
                                    ,in_stack_fffffffffffff95c,(bool)in_stack_fffffffffffff95b,
                                    (char **)in_stack_fffffffffffff990.ptr_);
              local_654 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                         in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_650);
              if (!bVar1) {
                testing::Message::Message(&local_660);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d4fbb);
                testing::internal::AssertHelper::AssertHelper
                          (&local_668,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x64d,pcVar4);
                testing::internal::AssertHelper::operator=(&local_668,&local_660);
                testing::internal::AssertHelper::~AssertHelper(&local_668);
                testing::Message::~Message((Message *)0x3d501e);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5076);
              if (local_2c == 0) {
                in_stack_fffffffffffff678 =
                     (CfdErrorCode *)
                     CONCAT44((int)((ulong)in_stack_fffffffffffff678 >> 0x20),
                              (int)alStack_2b0[local_328 * 0x13]);
                in_stack_fffffffffffff680 =
                     (char *)((ulong)in_stack_fffffffffffff680 & 0xffffffff00000000);
                in_stack_fffffffffffff670 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44((int)((ulong)in_stack_fffffffffffff670 >> 0x20),1);
                local_840 = local_388;
                in_stack_fffffffffffff70c =
                     CfdAddPubkeyHashSignByHandle
                               ((void *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8
                                                ),in_stack_fffffffffffffbb0.data_,
                                (char *)in_stack_fffffffffffffba8.ptr_,in_stack_fffffffffffffba4,
                                in_stack_fffffffffffffba0,
                                (char *)CONCAT44(uVar10,in_stack_fffffffffffffb98),
                                (char *)in_stack_fffffffffffffbd0.ptr_,
                                (bool)in_stack_fffffffffffffb97,in_stack_fffffffffffffbe0,
                                (bool)in_stack_fffffffffffffb96);
                local_2c = in_stack_fffffffffffff70c;
                testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                          ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                           in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)&stack0xfffffffffffff988);
                in_stack_fffffffffffff708 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff708);
                if (!bVar1) {
                  testing::Message::Message((Message *)&stack0xfffffffffffff978);
                  in_stack_fffffffffffff700 =
                       (char **)testing::AssertionResult::failure_message
                                          ((AssertionResult *)0x3d51ad);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffff970,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                             ,0x654,(char *)in_stack_fffffffffffff700);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&stack0xfffffffffffff970,
                             (Message *)&stack0xfffffffffffff978);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&stack0xfffffffffffff970);
                  testing::Message::~Message((Message *)0x3d5210);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5265);
              }
            }
            else {
              uVar7 = (undefined4)((ulong)&local_388 >> 0x20);
              local_2c = CfdCalculateEcSignature
                                   (in_stack_fffffffffffff978.ptr_,
                                    (char *)in_stack_fffffffffffff970.data_,
                                    in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960.ptr_
                                    ,in_stack_fffffffffffff95c,(bool)in_stack_fffffffffffff95b,
                                    (char **)in_stack_fffffffffffff990.ptr_);
              local_5b4 = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                         in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
              uVar9 = (undefined4)((ulong)in_stack_fffffffffffff680 >> 0x20);
              uVar8 = (undefined4)((ulong)in_stack_fffffffffffff670 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b0);
              if (!bVar1) {
                testing::Message::Message(&local_5c0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d487b);
                testing::internal::AssertHelper::AssertHelper
                          (&local_5c8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x636,pcVar4);
                testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
                testing::internal::AssertHelper::~AssertHelper(&local_5c8);
                testing::Message::~Message((Message *)0x3d48de);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d4936);
              piVar6 = (int *)CONCAT44(uVar8,(int)alStack_2b0[local_328 * 0x13]);
              in_stack_fffffffffffff680 = (char *)CONCAT44(uVar9,1);
              in_stack_fffffffffffff678 =
                   (CfdErrorCode *)((ulong)in_stack_fffffffffffff678 & 0xffffffff00000000);
              local_2c = CfdAddTxSignByHandle
                                   ((void *)CONCAT44(uVar10,in_stack_fffffffffffffb98),
                                    (void *)CONCAT17(in_stack_fffffffffffffb97,
                                                     CONCAT16(in_stack_fffffffffffffb96,
                                                              in_stack_fffffffffffffb90)),
                                    (char *)in_stack_fffffffffffffb88.data_,
                                    in_stack_fffffffffffffb84,in_stack_fffffffffffffb80,
                                    (char *)in_stack_fffffffffffffb78.ptr_,
                                    (bool)in_stack_fffffffffffffb77,in_stack_fffffffffffffbb8,
                                    (bool)in_stack_fffffffffffffb76,(bool)in_stack_fffffffffffffb75)
              ;
              local_5dc = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                         in_stack_fffffffffffff678,piVar6);
              uVar8 = (undefined4)((ulong)piVar6 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5d8);
              if (!bVar1) {
                testing::Message::Message(&local_5e8);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d4a59);
                testing::internal::AssertHelper::AssertHelper
                          (&local_5f0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x63d,pcVar4);
                testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
                testing::internal::AssertHelper::~AssertHelper(&local_5f0);
                testing::Message::~Message((Message *)0x3d4abc);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d4b14);
              in_stack_fffffffffffff670 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uVar8,(int)alStack_2b0[local_328 * 0x13]);
              in_stack_fffffffffffff680 =
                   (char *)((ulong)in_stack_fffffffffffff680 & 0xffffffff00000000);
              in_stack_fffffffffffff678 =
                   (CfdErrorCode *)((ulong)in_stack_fffffffffffff678 & 0xffffffff00000000);
              local_840 = (bool *******)CONCAT44(uVar7,1);
              local_2c = CfdAddTxSignByHandle
                                   ((void *)CONCAT44(uVar10,in_stack_fffffffffffffb98),
                                    (void *)CONCAT17(in_stack_fffffffffffffb97,
                                                     CONCAT16(in_stack_fffffffffffffb96,
                                                              in_stack_fffffffffffffb90)),
                                    (char *)in_stack_fffffffffffffb88.data_,
                                    in_stack_fffffffffffffb84,in_stack_fffffffffffffb80,
                                    (char *)in_stack_fffffffffffffb78.ptr_,
                                    (bool)in_stack_fffffffffffffb77,in_stack_fffffffffffffbb8,
                                    (bool)in_stack_fffffffffffffb76,(bool)in_stack_fffffffffffffb75)
              ;
              in_stack_fffffffffffff9fc = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                         in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffa00);
              if (!bVar1) {
                testing::Message::Message((Message *)&stack0xfffffffffffff9f0);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d4c38);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff9e8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x643,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffff9e8,
                           (Message *)&stack0xfffffffffffff9f0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffff9e8);
                testing::Message::~Message((Message *)0x3d4c9b);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d4cf3);
              local_2c = CfdAddScriptHashLastSignByHandle
                                   (in_stack_fffffffffffff8f8.ptr_,in_stack_fffffffffffff8f0.data_,
                                    (char *)in_stack_fffffffffffff8e8.ptr_,in_stack_fffffffffffff8e4
                                    ,in_stack_fffffffffffff8e0,
                                    (char *)CONCAT44(in_stack_fffffffffffff8dc,
                                                     in_stack_fffffffffffff8d8));
              local_62c = 0;
              testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                        ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                         in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_628);
              if (!bVar1) {
                testing::Message::Message(&local_638);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d4df4);
                testing::internal::AssertHelper::AssertHelper
                          (&local_640,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                           ,0x648,pcVar4);
                testing::internal::AssertHelper::operator=(&local_640,&local_638);
                testing::internal::AssertHelper::~AssertHelper(&local_640);
                testing::Message::~Message((Message *)0x3d4e57);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d4eac);
            }
          }
          if (local_380 != 0) {
            CfdFreeStringBuffer((char *)in_stack_fffffffffffff678);
            local_380 = 0;
          }
          if (local_388 != (bool *******)0x0) {
            CfdFreeStringBuffer((char *)in_stack_fffffffffffff678);
            local_388 = (bool *******)0x0;
          }
          if (local_390 != 0) {
            CfdFreeStringBuffer((char *)in_stack_fffffffffffff678);
            local_390 = 0;
          }
        }
        else {
          in_stack_fffffffffffff678 = (CfdErrorCode *)alStack_2b0[local_328 * 0x13 + -3];
          in_stack_fffffffffffff680 = (char *)alStack_2b0[local_328 * 0x13 + -4];
          in_stack_fffffffffffff670 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44((int)((ulong)in_stack_fffffffffffff670 >> 0x20),1);
          local_840 = (bool *******)((ulong)local_840 & 0xffffffff00000000);
          in_stack_fffffffffffff7f4 =
               CfdAddSignWithPrivkeyByHandle
                         (in_stack_fffffffffffffac8,
                          (void *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                          (char *)in_stack_fffffffffffffab8.ptr_,in_stack_fffffffffffffab4,
                          (char *)in_stack_fffffffffffffaa8.ptr_,in_stack_fffffffffffffaa4,
                          (bool)in_stack_fffffffffffffaa3,(bool)in_stack_fffffffffffffaa2,
                          in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffaf8.ptr_);
          local_494 = 0;
          local_2c = in_stack_fffffffffffff7f4;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                     in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffb70);
          in_stack_fffffffffffff7f0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7f0);
          if (!bVar1) {
            testing::Message::Message(&local_4a0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d3a6c);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x608,pcVar4);
            testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
            testing::internal::AssertHelper::~AssertHelper(&local_4a8);
            testing::Message::~Message((Message *)0x3d3acf);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d3b24);
        }
      }
      if (local_2c == 0) {
        in_stack_fffffffffffff968 = (char *)0x0;
        local_2c = CfdFinalizeTransaction(in_stack_fffffffffffff670,local_840,(char **)0x3d532c);
        local_6ac = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                   in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffff958);
        if (!bVar1) {
          testing::Message::Message(&local_6b8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d53d8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_6c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x669,pcVar4);
          testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
          testing::internal::AssertHelper::~AssertHelper(&local_6c0);
          testing::Message::~Message((Message *)0x3d543b);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5490);
        if (local_2c == 0) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_6d0,"exp_datas[idx].signed_tx","tx_hex",
                     (char *)alStack_2b0[local_328 * 0x13 + 4],in_stack_fffffffffffff968);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6d0);
          if (!bVar1) {
            testing::Message::Message(&local_6d8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d5549);
            testing::internal::AssertHelper::AssertHelper
                      (&local_6e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x66b,pcVar4);
            testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
            testing::internal::AssertHelper::~AssertHelper(&local_6e0);
            testing::Message::~Message((Message *)0x3d55a6);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d55fb);
          CfdFreeStringBuffer((char *)in_stack_fffffffffffff678);
        }
      }
      if (local_2c == 0) {
        local_2c = CfdVerifyTxSignByHandle
                             (in_stack_fffffffffffff808,
                              (void *)CONCAT44(uVar2,in_stack_fffffffffffff800),
                              in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4);
        if ((local_2c != 0) && ((in_stack_fffffffffffffb84 & 0x1000000) != 0)) {
          local_6e8 = (char *)0x0;
          CfdGetLastErrorMessage
                    ((void *)CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                     in_stack_fffffffffffff700);
          local_6f0 = "The script analysis of tapscript is not supported.";
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_700,"tapscript_err_msg","err_msg",
                     "The script analysis of tapscript is not supported.",local_6e8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_700);
          if (!bVar1) {
            testing::Message::Message((Message *)&stack0xfffffffffffff8f8);
            in_stack_fffffffffffff6d0 =
                 (ScopedTrace *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x3d5744);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffff8f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                       ,0x677,(char *)in_stack_fffffffffffff6d0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffff8f0,(Message *)&stack0xfffffffffffff8f8)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff8f0)
            ;
            testing::Message::~Message((Message *)0x3d57a1);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d57f6);
          iVar3 = strcmp(local_6f0,local_6e8);
          if (iVar3 == 0) {
            local_2c = 0;
          }
          CfdFreeStringBuffer((char *)in_stack_fffffffffffff678);
          local_6e8 = (char *)0x0;
        }
        in_stack_fffffffffffff8dc = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                   in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
        in_stack_fffffffffffff6cf =
             testing::AssertionResult::operator_cast_to_bool
                       ((AssertionResult *)&stack0xfffffffffffff8e0);
        if (!(bool)in_stack_fffffffffffff6cf) {
          testing::Message::Message(&local_730);
          in_stack_fffffffffffff6c0 =
               testing::AssertionResult::failure_message((AssertionResult *)0x3d58d9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_738,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                     ,0x67e,in_stack_fffffffffffff6c0);
          testing::internal::AssertHelper::operator=(&local_738,&local_730);
          testing::internal::AssertHelper::~AssertHelper(&local_738);
          testing::Message::~Message((Message *)0x3d5936);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d598b);
      }
      in_stack_fffffffffffff6bc = CfdFreeTransactionHandle(in_stack_fffffffffffff670,local_840);
      local_754 = 0;
      local_73c = in_stack_fffffffffffff6bc;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                 in_stack_fffffffffffff678,(int *)in_stack_fffffffffffff670);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_750);
      in_stack_fffffffffffff6b8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff6b8);
      if (!bVar1) {
        testing::Message::Message(&local_760);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d5a54);
        testing::internal::AssertHelper::AssertHelper
                  (&local_768,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                   ,0x682,pcVar4);
        testing::internal::AssertHelper::operator=(&local_768,&local_760);
        testing::internal::AssertHelper::~AssertHelper(&local_768);
        testing::Message::~Message((Message *)0x3d5ab1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5b06);
    }
    testing::ScopedTrace::~ScopedTrace(&local_329);
  }
  local_2c = CfdFreeHandle(in_stack_fffffffffffff678);
  local_77c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff688,in_stack_fffffffffffff680,in_stack_fffffffffffff678,
             (int *)in_stack_fffffffffffff670);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_778);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3d5bf2);
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x694,pcVar4);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    testing::Message::~Message((Message *)0x3d5c4f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d5ca4);
  return;
}

Assistant:

TEST(cfdcapi_transaction, ElementsSignTransactionTest) {
  void* handle = nullptr;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdSignTransactionTestData {
    int network;
    int key_network;
    const char* txid;
    uint32_t vout;
    const char* descriptor;
    int64_t utxo_amount;
    const char* utxo_commitment;
    const char* redeem_script;
    const char* tapscript_control;
    const char* tapleaf_hash;
    const char* annex;
    const char* aux_rand;
    const char* pubkey;
    const char* privkey;
    int sighash_type;
    const char* txout_address;
    int64_t amount;
    const char* asset;
    const char* signed_tx;
    bool use_direct_sign;
    int hash_type;
  };
  const struct CfdSignTransactionTestData exp_datas[] = {
    {  // p2wpkh
      kCfdNetworkElementsRegtest,
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wpkh(023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44)",
      2500000000,
      "",
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "el1qqtl9a3n6878ex25u0wv8u5qlzpfkycc0cftk65t52pkauk55jqka0fajk8d80lafn4t9kqxe77cu9ez2dyr6sq54lwy009uex",
      2499999000,
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
      "020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51802fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e80000000000000000024730440220451027781118259d92ca7fef774b3d90fe90e92109879a123f1d266c6dbf480602204e9612cf045f499c00cad4c2bf07a95cf9aad192bbfb18f95e56770ea324cb3c0121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c440000000000",
      false, kCfdP2wpkh
    },
    {  // p2wpkh auto sign
      kCfdNetworkElementsRegtest,
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wpkh(023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44)",
      2500000000,
      "",
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "el1qqtl9a3n6878ex25u0wv8u5qlzpfkycc0cftk65t52pkauk55jqka0fajk8d80lafn4t9kqxe77cu9ez2dyr6sq54lwy009uex",
      2499999000,
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
      "020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51802fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e80000000000000000024730440220451027781118259d92ca7fef774b3d90fe90e92109879a123f1d266c6dbf480602204e9612cf045f499c00cad4c2bf07a95cf9aad192bbfb18f95e56770ea324cb3c0121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c440000000000",
      true, kCfdP2wpkh
    },
    {  // p2wsh-multisig
      kCfdNetworkElementsRegtest,
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wsh(multi(1,023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae))",
      2500000000,
      "",
      "5121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c442103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae52ae",
      nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "el1qqtl9a3n6878ex25u0wv8u5qlzpfkycc0cftk65t52pkauk55jqka0fajk8d80lafn4t9kqxe77cu9ez2dyr6sq54lwy009uex",
      2499999000,
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
      "020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51802fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e8000000000000000003004730440220159cf45907d607b3200f6f66823715477fb46a25389c6105925ddfd6149a8c6402206ba5bbc948e273fef511ddb77bcd4e78eb78a34578dd00e290401ccf9f3e7cce01475121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c442103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae52ae0000000000",
      false, kCfdP2wsh
    },
    {  // blind p2wpkh
      kCfdNetworkElementsRegtest,
      kCfdNetworkRegtest,
      "cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd", 0,
      "wpkh(023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44)",
      2500000000,
      "08b760fd74cae28eaa41126b3c1129b2d708d893e17b4e61bd9d5a5b12a1c7643b",
      nullptr, nullptr, nullptr, nullptr, nullptr,
      "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
      "28190dff04c40f130b7be4a597213338cb8860ff38bbab5236bd1b3ff8472554",
      kCfdSigHashAll,
      "el1qqtl9a3n6878ex25u0wv8u5qlzpfkycc0cftk65t52pkauk55jqka0fajk8d80lafn4t9kqxe77cu9ez2dyr6sq54lwy009uex",
      2499999000,
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
      "020000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000009502f51802fe5ec67a3f8f932a9c7b987e501f105362630fc2576d5174506dde5a94902dd7160014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a80125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000003e80000000000000000024730440220036e63bafeb6b76f1d5b94c248f7bbdcc1904046627f0712a2105930ae31dda8022028b49544faf211cd632c12e38efa97fdc1233122418dbb035194b83e689b6de80121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c440000000000",
      false, kCfdP2wpkh
    },
  };
  size_t list_size = sizeof(exp_datas) / sizeof(struct CfdSignTransactionTestData);

  for (size_t idx = 0; idx < list_size; ++idx) {
    SCOPED_TRACE("index: " + std::to_string(idx));
    void* create_handle = nullptr;
    char* sighash = nullptr;
    char* sig = nullptr;
    char* tmp_sig = nullptr;
    ret = CfdInitializeTransaction(
        handle, exp_datas[idx].network, 2, 0, nullptr, &create_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((NULL == create_handle));
    if (ret == kCfdSuccess) {
      ret = CfdSetTransactionUtxoData(handle, create_handle,
          exp_datas[idx].txid, exp_datas[idx].vout, exp_datas[idx].utxo_amount,
          exp_datas[idx].utxo_commitment, exp_datas[idx].descriptor,
          nullptr, exp_datas[idx].asset, nullptr, true);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddTransactionOutput(handle, create_handle,
          exp_datas[idx].amount, exp_datas[idx].txout_address, nullptr,
          exp_datas[idx].asset);
      EXPECT_EQ(kCfdSuccess, ret);

      ret = CfdAddTransactionOutput(handle, create_handle,
          exp_datas[idx].utxo_amount - exp_datas[idx].amount,
          nullptr, nullptr, exp_datas[idx].asset);
      EXPECT_EQ(kCfdSuccess, ret);

      bool has_tapscript = false;
      if (ret != kCfdSuccess) {
        // do nothing
      } else if (exp_datas[idx].use_direct_sign) {
        ret = CfdAddSignWithPrivkeyByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout, exp_datas[idx].privkey,
            exp_datas[idx].sighash_type, false, true, exp_datas[idx].aux_rand,
            exp_datas[idx].annex);
        EXPECT_EQ(kCfdSuccess, ret);
      } else {
        uint32_t code_separator_pos = cfd::core::kDefaultCodeSeparatorPosition;
        ret = CfdCreateSighashByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout,
            exp_datas[idx].sighash_type, false,
            (exp_datas[idx].redeem_script) ? nullptr : exp_datas[idx].pubkey,
            exp_datas[idx].redeem_script,
            exp_datas[idx].tapleaf_hash, code_separator_pos,
            exp_datas[idx].annex, &sighash);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret != kCfdSuccess) {
          // do nothing
        } else if (strlen(exp_datas[idx].pubkey) == 64) {
          // taproot/tapscript
          ret = CfdSignSchnorr(handle, sighash,
              exp_datas[idx].privkey, exp_datas[idx].aux_rand, &tmp_sig);
          EXPECT_EQ(kCfdSuccess, ret);
          ret = CfdAddSighashTypeInSchnorrSignature(handle, tmp_sig,
              exp_datas[idx].sighash_type, false, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          if (exp_datas[idx].redeem_script != nullptr) {
            has_tapscript = true;
            ret = CfdAddTxSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                exp_datas[idx].hash_type, sig, false,
                exp_datas[idx].sighash_type, false, true);
            EXPECT_EQ(kCfdSuccess, ret);

            ret = CfdAddTaprootSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                nullptr, exp_datas[idx].redeem_script,
                exp_datas[idx].tapscript_control, exp_datas[idx].annex);
            EXPECT_EQ(kCfdSuccess, ret);
          } else {
            ret = CfdAddTaprootSignByHandle(handle, create_handle,
                exp_datas[idx].txid, exp_datas[idx].vout,
                sig, nullptr, nullptr, exp_datas[idx].annex);
            EXPECT_EQ(kCfdSuccess, ret);
          }
        } else if (exp_datas[idx].redeem_script != nullptr) {
          // script
          ret = CfdCalculateEcSignature(handle, sighash,
              exp_datas[idx].privkey, nullptr,
              exp_datas[idx].key_network, true, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          // multisig first
          ret = CfdAddTxSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, "", false,
              exp_datas[idx].sighash_type, false, true);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddTxSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, sig, true,
              exp_datas[idx].sighash_type, false, false);
          EXPECT_EQ(kCfdSuccess, ret);

          ret = CfdAddScriptHashLastSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, exp_datas[idx].redeem_script);
          EXPECT_EQ(kCfdSuccess, ret);
        } else {
          ret = CfdCalculateEcSignature(handle, sighash,
              exp_datas[idx].privkey, nullptr,
              exp_datas[idx].key_network, true, &sig);
          EXPECT_EQ(kCfdSuccess, ret);

          if (ret == kCfdSuccess) {
            ret = CfdAddPubkeyHashSignByHandle(handle, create_handle,
              exp_datas[idx].txid, exp_datas[idx].vout,
              exp_datas[idx].hash_type, exp_datas[idx].pubkey,
              sig, true, exp_datas[idx].sighash_type, false);
            EXPECT_EQ(kCfdSuccess, ret);
          }
        }

        if (sighash != nullptr) {
          CfdFreeStringBuffer(sighash);
          sighash = nullptr;
        }
        if (sig != nullptr) {
          CfdFreeStringBuffer(sig);
          sig = nullptr;
        }
        if (tmp_sig != nullptr) {
          CfdFreeStringBuffer(tmp_sig);
          tmp_sig = nullptr;
        }
      }

      if (ret == kCfdSuccess) {
        char* tx_hex = nullptr;
        ret = CfdFinalizeTransaction(handle, create_handle, &tx_hex);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          EXPECT_STREQ(exp_datas[idx].signed_tx, tx_hex);
          CfdFreeStringBuffer(tx_hex);
        }
      }

      if (ret == kCfdSuccess) {
        ret = CfdVerifyTxSignByHandle(handle, create_handle,
            exp_datas[idx].txid, exp_datas[idx].vout);
        if ((ret != kCfdSuccess) && has_tapscript) {
          char* err_msg = NULL;
          CfdGetLastErrorMessage(handle, &err_msg);
          const char* tapscript_err_msg = "The script analysis of tapscript is not supported.";
          EXPECT_STREQ(tapscript_err_msg, err_msg);
          if (strcmp(tapscript_err_msg, err_msg) == 0) {
            ret = kCfdSuccess;
          }
          CfdFreeStringBuffer(err_msg);
          err_msg = NULL;
        }
        EXPECT_EQ(kCfdSuccess, ret);
      }

      int tmp_ret = CfdFreeTransactionHandle(handle, create_handle);
      EXPECT_EQ(kCfdSuccess, tmp_ret);
    }

#if 0
    ret = CfdGetLastErrorCode(handle);
    if (ret != kCfdSuccess) {
      char* str_buffer = NULL;
      ret = CfdGetLastErrorMessage(handle, &str_buffer);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_STREQ("", str_buffer);
      CfdFreeStringBuffer(str_buffer);
      str_buffer = NULL;
      break;
    }
#endif
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}